

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::traverseRedefine(TraverseSchema *this,DOMElement *redefineElem)

{
  SchemaInfo *pSVar1;
  RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *pRVar2;
  SchemaInfo *pSVar3;
  RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *pRVar4;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_28;
  
  pSVar1 = this->fSchemaInfo;
  if (redefineElem == (DOMElement *)0x0) {
    local_28.fScopeAdded = false;
  }
  else {
    local_28.fScopeAdded = retrieveNamespaceMapping(this,redefineElem);
  }
  pRVar2 = this->fPreprocessedNodes->fBucketList
           [(ulong)redefineElem % this->fPreprocessedNodes->fHashModulus];
  pRVar4 = (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0;
  if (pRVar2 != (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0) {
    do {
      pRVar4 = pRVar2;
      if ((DOMElement *)pRVar2->fKey == redefineElem) break;
      pRVar2 = pRVar2->fNext;
      pRVar4 = (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0;
    } while (pRVar2 != (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0);
  }
  if (pRVar4 == (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0) {
    pSVar3 = (SchemaInfo *)0x0;
  }
  else {
    pSVar3 = pRVar4->fData;
  }
  local_28.fSchemaInfo = pSVar1;
  if (pSVar3 != (SchemaInfo *)0x0) {
    pSVar1 = this->fSchemaInfo;
    this->fSchemaInfo = pSVar3;
    processChildren(this,pSVar3->fSchemaRootElement);
    this->fSchemaInfo = pSVar1;
    processChildren(this,redefineElem);
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_28);
  return;
}

Assistant:

void TraverseSchema::traverseRedefine(const DOMElement* const redefineElem) {

    NamespaceScopeManager nsMgr(redefineElem, fSchemaInfo, this);

    SchemaInfo* saveInfo = fSchemaInfo;
    SchemaInfo* redefinedInfo = fPreprocessedNodes->get(redefineElem);

    if (redefinedInfo) {

        // Now we have to march through our nicely-renamed schemas. When
        // we do these traversals other <redefine>'s may perhaps be
        // encountered; we leave recursion to sort this out.
        fSchemaInfo = redefinedInfo;
        processChildren(fSchemaInfo->getRoot());
        fSchemaInfo = saveInfo;

        // Now traverse our own <redefine>
        processChildren(redefineElem);
    }
}